

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianPoint::~IfcCartesianPoint(IfcCartesianPoint *this)

{
  ~IfcCartesianPoint((IfcCartesianPoint *)&this[-1].super_IfcPoint.field_0x40);
  return;
}

Assistant:

IfcCartesianPoint() : Object("IfcCartesianPoint") {}